

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::aLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int beamlet;
  uint beamlet_00;
  ostream *poVar4;
  clock_t cVar5;
  Station *pSVar6;
  clock_t cVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  Plan *pPVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  double c_eval;
  double dVar15;
  double dVar16;
  double local_e0;
  uint local_d4;
  int local_cc;
  double local_c8;
  double local_b0;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  a_list;
  undefined1 local_60 [24];
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  
  iVar1 = this->ls_type;
  a_list.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a_list.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_list.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  pcVar10 = (char *)P;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  local_e0 = Plan::getEvaluation(P);
  if (verbose) {
    pcVar10 = "Staring aperture local search...";
    poVar4 = std::operator<<((ostream *)&std::cout,"Staring aperture local search...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  iVar9 = -1;
  local_d4 = 1;
  bVar8 = false;
  cVar5 = clock();
  local_cc = -1;
  local_c8 = local_e0;
  do {
    if (local_d4 == 0) goto LAB_00125996;
    getShuffledApertureNeighbors
              ((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                *)local_60,(ApertureILS *)pcVar10,P);
    iVar9 = iVar9 + 1;
    pcVar10 = (char *)local_60;
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::_M_move_assign(&a_list);
    std::
    _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::~_Vector_base((_Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                     *)local_60);
    if (verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Neighborhood ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar9);
      poVar4 = std::operator<<(poVar4," size ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar10 = "    current ";
      std::operator<<(poVar4,"    current ");
      poVar4 = std::ostream::_M_insert<double>(local_e0);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    c_eval = Plan::getEvaluation(P);
    lVar14 = 0;
    local_b0 = local_e0;
    local_e0 = local_c8;
    local_d4 = 0;
    bVar8 = false;
    for (uVar13 = 0;
        uVar13 < (ulong)((long)a_list.
                               super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)a_list.
                               super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar13 = uVar13 + 1)
    {
      pPVar11 = P;
      pSVar6 = Plan::get_station(P,*(int *)((long)&((a_list.
                                                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                  .first + lVar14));
      iVar2 = *(int *)((long)&((a_list.
                                super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first).second + lVar14);
      iVar3 = *(int *)((long)&((a_list.
                                super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->second).first + lVar14);
      beamlet = *(int *)((long)&((a_list.
                                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->second).second +
                        lVar14);
      if (iVar3 < 0) {
        local_e0 = closeBeamlet((ApertureILS *)pPVar11,beamlet,-iVar3,iVar2,pSVar6,c_eval,P);
      }
      else {
        local_e0 = openBeamlet((ApertureILS *)pPVar11,beamlet,iVar2,pSVar6,c_eval,P);
      }
      iVar12 = (int)uVar13;
      if (verbose) {
        poVar4 = std::operator<<((ostream *)&std::cout,"  aLS Neighbor ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar12);
        poVar4 = std::operator<<(poVar4," over station ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pSVar6->angle);
        poVar4 = std::operator<<(poVar4," aperture ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        poVar4 = std::operator<<(poVar4," beamlet ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,beamlet);
        poVar4 = std::operator<<(poVar4," operator ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
        std::operator<<(poVar4," result ");
        poVar4 = std::ostream::_M_insert<double>(local_e0);
        std::endl<char,std::char_traits<char>>(poVar4);
        if (1e-05 < local_b0 - local_e0) {
          pcVar10 = "     improvement ";
          std::operator<<((ostream *)&std::cout,"     improvement ");
          poVar4 = std::ostream::_M_insert<double>(local_e0);
          std::endl<char,std::char_traits<char>>(poVar4);
          if (iVar1 == 0) goto LAB_0012580f;
          local_d4 = 1;
          local_b0 = local_e0;
          local_cc = iVar12;
        }
      }
      else {
        dVar15 = local_b0 - local_e0;
        dVar16 = local_e0;
        if (dVar15 <= 1e-05) {
          dVar16 = local_b0;
        }
        pcVar10 = (char *)(ulong)local_d4;
        if (1e-05 < dVar15) {
          pcVar10 = (char *)0x1;
        }
        local_d4 = (uint)pcVar10;
        if (1e-05 < dVar15) {
          local_cc = iVar12;
        }
        local_b0 = dVar16;
        if (1e-05 < dVar15 && iVar1 == 0) {
LAB_0012580f:
          bVar8 = (bool)(bVar8 | ((long)a_list.
                                        super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)a_list.
                                        super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U ==
                                 uVar13);
          local_d4 = 1;
          local_c8 = local_e0;
          local_cc = iVar12;
          goto LAB_0012593d;
        }
      }
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_60,
                 pSVar6);
      pcVar10 = (char *)local_60;
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               local_60);
      if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl._M_node._M_size != 0) {
        local_e0 = Plan::incremental_eval(P,pSVar6,&diff);
        pcVar10 = (char *)pSVar6;
      }
      bVar8 = (bool)(bVar8 | uVar13 == ((long)a_list.
                                              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)a_list.
                                              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U);
      cVar7 = clock();
      if (((max_time != 0.0) || (NAN(max_time))) &&
         (max_time <= (double)(cVar7 - cVar5) / 1000000.0)) {
        if (verbose) {
          pcVar10 = "  aLS timed out ";
          poVar4 = std::operator<<((ostream *)&std::cout,"  aLS timed out ");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        break;
      }
      lVar14 = lVar14 + 0x10;
    }
    local_c8 = local_e0;
    if ((~(byte)local_d4 & 1) == 0 && iVar1 != 0) {
      lVar14 = (long)local_cc;
      pPVar11 = P;
      pSVar6 = Plan::get_station(P,a_list.
                                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar14].first.first);
      iVar2 = a_list.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].first.second;
      iVar3 = a_list.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].second.first;
      beamlet_00 = a_list.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14].second.second;
      pcVar10 = (char *)(ulong)beamlet_00;
      if (iVar3 < 0) {
        local_c8 = closeBeamlet((ApertureILS *)pPVar11,beamlet_00,-iVar3,iVar2,pSVar6,local_e0,P);
      }
      else {
        local_c8 = openBeamlet((ApertureILS *)pPVar11,beamlet_00,iVar2,pSVar6,local_e0,P);
      }
    }
    local_e0 = local_b0;
LAB_0012593d:
    cVar7 = clock();
  } while (((max_time == 0.0) && (!NAN(max_time))) ||
          ((double)(cVar7 - cVar5) / 1000000.0 < max_time));
  if (verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  aLS timed out ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
LAB_00125996:
  std::operator<<((ostream *)&std::cout,"  aLS best: ");
  std::ostream::_M_insert<double>(local_e0);
  pcVar10 = ": [nolo] : ";
  if (bVar8) {
    pcVar10 = ": [lo] : ";
  }
  std::operator<<((ostream *)&std::cout,pcVar10);
  cVar7 = clock();
  poVar4 = std::ostream::_M_insert<double>(max_time);
  std::operator<<(poVar4," :");
  poVar4 = std::ostream::_M_insert<double>((double)(cVar7 - cVar5) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&a_list.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 );
  return local_e0;
}

Assistant:

double ApertureILS::aLocalSearch(Plan& P, double max_time, bool verbose) {
  Station *s;
  std::clock_t time_end, time_begin;
  double used_time;
  double local_best_eval, aux_eval, current_eval;
  bool improvement=true, best_improvement=ls_type;
  vector < pair< pair<int, int>, pair<int, int>> > a_list;
  pair< pair<int, int>, pair<int, int>> tabu;
  pair< pair<int, int>, pair<int,int>> best_move;
  list<pair<int, double> > diff;
  int i,j, best_n, aperture, beamlet, sign;
  bool completed = false;
  best_n = -1;
  j=-1;
  local_best_eval = aux_eval= P.getEvaluation();
  if (verbose)
    cout << "Staring aperture local search..." << endl;
  
  time_begin=clock();
  
  while (improvement) {
    j++;
    a_list = getShuffledApertureNeighbors(P);
    //a_list = getOrderedApertureNeighbors(P);
    improvement = false;
    completed = false;
    
    if (verbose)
      cout << "Neighborhood "<<j<< " size "<< a_list.size() << "    current " << local_best_eval << endl;
    
    current_eval = P.getEvaluation();
    for (i = 0; i < a_list.size(); i++) {
      s = P.get_station(a_list[i].first.first);
      aperture = a_list[i].first.second;
      beamlet = a_list[i].second.second;
      sign = a_list[i].second.first;
            
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, current_eval, P); 
      } else {
        aux_eval = openBeamlet(beamlet, aperture, *s, current_eval, P);
      }

      if (verbose) {
          cout << "  aLS Neighbor " << i << " over station " << s->getAngle() << " aperture " << aperture << " beamlet " << beamlet << " operator " << sign << " result " << aux_eval << endl;
      }

      if ((local_best_eval - aux_eval) > 0.00001){
        local_best_eval = aux_eval;
        best_n = i;
        improvement = true;
        if (verbose)
          cout << "     improvement " << aux_eval << endl ;
        if (!best_improvement) { 
          if (i==(a_list.size()-1)) completed=true;
          i = a_list.size();
          break;
        }
      }

      diff = s->undoLast();
      if (diff.size() > 0)
        aux_eval = P.incremental_eval(*s, diff);
      
      if (i==(a_list.size()-1)) completed=true;
      
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        if (verbose)
          cout << "  aLS timed out " << endl;
        break;
      }
      
    }
    
    //Apply best neighbor
    if (improvement && best_improvement) {
      s = P.get_station(a_list[best_n].first.first);
      aperture = a_list[best_n].first.second;
      beamlet = a_list[best_n].second.second;
      sign = a_list[best_n].second.first;
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, aux_eval, P);
      } else{
        aux_eval = openBeamlet(beamlet, aperture, *s, aux_eval, P);
      }
    }
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    if (max_time!=0 && used_time >= max_time) {
      if (verbose)
        cout << "  aLS timed out " << endl;
      break;
    }
  }
  
  cout << "  aLS best: " << local_best_eval ;
  if (!completed) cout << ": [nolo] : ";
  else  cout << ": [lo] : ";
  time_end = clock();
  used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
  cout << max_time << " :" << used_time << endl;
  
  return(local_best_eval);
}